

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O2

void __thiscall
RenX::BanDatabase::add
          (BanDatabase *this,Server *server,PlayerInfo *player,string_view banner,string_view reason
          ,seconds length,uint16_t flags)

{
  pointer ppPVar1;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> uVar2;
  byte bVar3;
  undefined8 uVar4;
  size_type sVar5;
  Core *this_00;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *pvVar6;
  key_type *__k;
  mapped_type *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  _Head_base<0UL,_RenX::BanDatabase::Entry_*,_false> __n;
  void *__buf;
  pointer ppPVar8;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> entry;
  string pluginData;
  string_view banner_local;
  
  banner_local._M_str = banner._M_str;
  banner_local._M_len = banner._M_len;
  std::make_unique<RenX::BanDatabase::Entry>();
  if (flags != 0) {
    *(uint16_t *)
     ((long)entry._M_t.
            super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
            ._M_t.
            super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
            .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x10) =
         flags | *(ushort *)
                  ((long)entry._M_t.
                         super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                         .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl +
                  0x10) | 0x8000;
  }
  uVar4 = std::chrono::_V2::system_clock::now();
  *(undefined8 *)
   ((long)entry._M_t.
          super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x18) = uVar4;
  *(rep *)((long)entry._M_t.
                 super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                 .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x20) =
       length.__r;
  *(uint64_t *)
   ((long)entry._M_t.
          super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x28) =
       player->steamid;
  *(uint32_t *)
   ((long)entry._M_t.
          super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x30) =
       player->ip32;
  *(undefined1 *)
   ((long)entry._M_t.
          super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
          ._M_t.
          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x34) = 0x20;
  __n._M_head_impl = (Entry *)entry;
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_not_of(&player->hwid,'0',0);
  if (sVar5 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)entry._M_t.
                      super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                      .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x38)
               ,&player->hwid);
  }
  pluginData._0_16_ = PlayerInfo::get_rdns(player);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)
             ((long)entry._M_t.
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x58),
             (basic_string_view<char,_std::char_traits<char>_> *)&pluginData);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)entry._M_t.
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x78),
             &player->name);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)
             ((long)entry._M_t.
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0x98),
             &banner_local);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)
             ((long)entry._M_t.
                    super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                    .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl + 0xb8),
             &reason);
  pluginData._M_string_length = 0;
  pluginData._M_dataplus._M_p = (pointer)&pluginData.field_2;
  pluginData.field_2._M_local_buf[0] = '\0';
  this_00 = getCore();
  pvVar6 = Core::getPlugins(this_00);
  ppPVar1 = (pvVar6->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar8 = (pvVar6->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppPVar8 != ppPVar1; ppPVar8 = ppPVar8 + 1
      ) {
    pbVar7 = &pluginData;
    bVar3 = (**(code **)(*(long *)*ppPVar8 + 0x130))(*ppPVar8,server,player,&pluginData);
    uVar2 = entry;
    __n._M_head_impl =
         (Entry *)CONCAT71((int7)((ulong)pbVar7 >> 8),pluginData._M_string_length != 0);
    if ((bVar3 & pluginData._M_string_length != 0) == 1) {
      __k = (key_type *)Jupiter::Plugin::getName_abi_cxx11_();
      this_01 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equal,_jessilib::text_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)((long)uVar2._M_t.
                                       super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                                       .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>.
                                       _M_head_impl + 0xd8),__k);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (this_01,&pluginData);
    }
  }
  std::
  vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
  ::
  emplace_back<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>
            ((vector<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,std::default_delete<RenX::BanDatabase::Entry>>>>
              *)&this->m_entries,&entry);
  write(this,(int)(this->m_entries).
                  super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                  .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,__buf,
        (size_t)__n._M_head_impl);
  std::__cxx11::string::~string((string *)&pluginData);
  std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>::
  ~unique_ptr(&entry);
  return;
}

Assistant:

void RenX::BanDatabase::add(RenX::Server *server, const RenX::PlayerInfo &player, std::string_view banner, std::string_view reason, std::chrono::seconds length, uint16_t flags) {
	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	if (flags != 0) {
		entry->set_active();
		entry->flags |= flags;
	}
	entry->timestamp = std::chrono::system_clock::now();
	entry->length = length;
	entry->steamid = player.steamid;
	entry->ip = player.ip32;
	entry->prefix_length = 32U;
	if (player.hwid.find_first_not_of('0') != std::string::npos) {
		entry->hwid = player.hwid;
	}
	entry->rdns = player.get_rdns();
	entry->name = player.name;
	entry->banner = banner;
	entry->reason = reason;

	// add plugin data
	std::string pluginData;
	for (Plugin* plugin : RenX::getCore()->getPlugins()) {
		if (plugin->RenX_OnBan(*server, player, pluginData)) {
			if (!pluginData.empty()) {
				entry->varData[plugin->getName()] = pluginData;
			}
		}
	}

	m_entries.push_back(std::move(entry));
	write(m_entries.back().get());
}